

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O1

void __thiscall
crnlib::
hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
::rehash(hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
         *this,uint new_hash_size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ulong uVar32;
  raw_node *prVar33;
  undefined1 *puVar34;
  undefined8 *puVar35;
  long lVar36;
  ulong uVar37;
  raw_node *prVar38;
  uint uVar39;
  ulong uVar40;
  uint uVar41;
  uint uVar42;
  undefined1 auVar43 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int iVar63;
  int iVar66;
  int iVar67;
  undefined1 auVar64 [16];
  int iVar68;
  undefined1 auVar65 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  int iVar82;
  int iVar86;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  elemental_vector local_38;
  uint local_28;
  undefined8 local_20;
  
  if ((this->m_num_valid <= new_hash_size) &&
     (uVar37 = (ulong)new_hash_size, (this->m_values).m_size != new_hash_size)) {
    local_38.m_p = (void *)0x0;
    local_38.m_size = 0;
    local_38.m_capacity = 0;
    local_28 = 0x20;
    local_20 = 0;
    if (new_hash_size != 0) {
      if (new_hash_size != 0) {
        elemental_vector::increase_capacity
                  (&local_38,new_hash_size,new_hash_size == 1,0x10,
                   vector<crnlib::hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>::raw_node>
                   ::object_mover,false);
      }
      auVar31 = _DAT_001b10b0;
      auVar30 = _DAT_001b10a0;
      auVar29 = _DAT_001b1090;
      auVar28 = _DAT_001b1080;
      auVar27 = _DAT_001b1070;
      auVar26 = _DAT_001b1060;
      auVar25 = _DAT_001b1050;
      if (local_38.m_size != new_hash_size) {
        uVar32 = (ulong)(new_hash_size - local_38.m_size) + 0xfffffffffffffff;
        uVar40 = uVar32 & 0xfffffffffffffff;
        auVar43._8_4_ = (int)uVar40;
        auVar43._0_8_ = uVar40;
        auVar43._12_4_ = (int)(uVar40 >> 0x20);
        puVar34 = (undefined1 *)((long)local_38.m_p + (ulong)local_38.m_size * 0x10 + 0xfc);
        lVar36 = 0;
        do {
          auVar61._8_4_ = (int)lVar36;
          auVar61._0_8_ = lVar36;
          auVar61._12_4_ = (int)((ulong)lVar36 >> 0x20);
          auVar64 = auVar43 ^ auVar31;
          auVar69 = (auVar61 | auVar30) ^ auVar31;
          iVar63 = auVar64._0_4_;
          iVar82 = -(uint)(iVar63 < auVar69._0_4_);
          iVar66 = auVar64._4_4_;
          auVar71._4_4_ = -(uint)(iVar66 < auVar69._4_4_);
          iVar67 = auVar64._8_4_;
          iVar86 = -(uint)(iVar67 < auVar69._8_4_);
          iVar68 = auVar64._12_4_;
          auVar71._12_4_ = -(uint)(iVar68 < auVar69._12_4_);
          auVar44._4_4_ = iVar82;
          auVar44._0_4_ = iVar82;
          auVar44._8_4_ = iVar86;
          auVar44._12_4_ = iVar86;
          auVar44 = pshuflw(in_XMM1,auVar44,0xe8);
          auVar70._4_4_ = -(uint)(auVar69._4_4_ == iVar66);
          auVar70._12_4_ = -(uint)(auVar69._12_4_ == iVar68);
          auVar70._0_4_ = auVar70._4_4_;
          auVar70._8_4_ = auVar70._12_4_;
          auVar53 = pshuflw(in_XMM2,auVar70,0xe8);
          auVar71._0_4_ = auVar71._4_4_;
          auVar71._8_4_ = auVar71._12_4_;
          auVar69 = pshuflw(auVar44,auVar71,0xe8);
          auVar64._8_4_ = 0xffffffff;
          auVar64._0_8_ = 0xffffffffffffffff;
          auVar64._12_4_ = 0xffffffff;
          auVar64 = (auVar69 | auVar53 & auVar44) ^ auVar64;
          auVar64 = packssdw(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar34[-0xf0] = 0;
          }
          auVar53._4_4_ = iVar82;
          auVar53._0_4_ = iVar82;
          auVar53._8_4_ = iVar86;
          auVar53._12_4_ = iVar86;
          auVar71 = auVar70 & auVar53 | auVar71;
          auVar64 = packssdw(auVar71,auVar71);
          auVar69._8_4_ = 0xffffffff;
          auVar69._0_8_ = 0xffffffffffffffff;
          auVar69._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64 ^ auVar69,auVar64 ^ auVar69);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._0_4_ >> 8 & 1) != 0) {
            puVar34[-0xe0] = 0;
          }
          auVar64 = (auVar61 | auVar29) ^ auVar31;
          auVar54._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
          auVar54._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
          auVar54._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
          auVar54._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
          auVar72._4_4_ = auVar54._0_4_;
          auVar72._0_4_ = auVar54._0_4_;
          auVar72._8_4_ = auVar54._8_4_;
          auVar72._12_4_ = auVar54._8_4_;
          iVar82 = -(uint)(auVar64._4_4_ == iVar66);
          iVar86 = -(uint)(auVar64._12_4_ == iVar68);
          auVar12._4_4_ = iVar82;
          auVar12._0_4_ = iVar82;
          auVar12._8_4_ = iVar86;
          auVar12._12_4_ = iVar86;
          auVar83._4_4_ = auVar54._4_4_;
          auVar83._0_4_ = auVar54._4_4_;
          auVar83._8_4_ = auVar54._12_4_;
          auVar83._12_4_ = auVar54._12_4_;
          auVar64 = auVar12 & auVar72 | auVar83;
          auVar64 = packssdw(auVar64,auVar64);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64 ^ auVar3,auVar64 ^ auVar3);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._0_4_ >> 0x10 & 1) != 0) {
            puVar34[-0xd0] = 0;
          }
          auVar64 = pshufhw(auVar64,auVar72,0x84);
          auVar13._4_4_ = iVar82;
          auVar13._0_4_ = iVar82;
          auVar13._8_4_ = iVar86;
          auVar13._12_4_ = iVar86;
          auVar69 = pshufhw(auVar54,auVar13,0x84);
          auVar44 = pshufhw(auVar64,auVar83,0x84);
          auVar45._8_4_ = 0xffffffff;
          auVar45._0_8_ = 0xffffffffffffffff;
          auVar45._12_4_ = 0xffffffff;
          auVar45 = (auVar44 | auVar69 & auVar64) ^ auVar45;
          auVar64 = packssdw(auVar45,auVar45);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._0_4_ >> 0x18 & 1) != 0) {
            puVar34[-0xc0] = 0;
          }
          auVar64 = (auVar61 | auVar28) ^ auVar31;
          auVar55._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
          auVar55._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
          auVar55._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
          auVar55._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
          auVar14._4_4_ = auVar55._0_4_;
          auVar14._0_4_ = auVar55._0_4_;
          auVar14._8_4_ = auVar55._8_4_;
          auVar14._12_4_ = auVar55._8_4_;
          auVar69 = pshuflw(auVar83,auVar14,0xe8);
          auVar46._0_4_ = -(uint)(auVar64._0_4_ == iVar63);
          auVar46._4_4_ = -(uint)(auVar64._4_4_ == iVar66);
          auVar46._8_4_ = -(uint)(auVar64._8_4_ == iVar67);
          auVar46._12_4_ = -(uint)(auVar64._12_4_ == iVar68);
          auVar73._4_4_ = auVar46._4_4_;
          auVar73._0_4_ = auVar46._4_4_;
          auVar73._8_4_ = auVar46._12_4_;
          auVar73._12_4_ = auVar46._12_4_;
          auVar64 = pshuflw(auVar46,auVar73,0xe8);
          auVar74._4_4_ = auVar55._4_4_;
          auVar74._0_4_ = auVar55._4_4_;
          auVar74._8_4_ = auVar55._12_4_;
          auVar74._12_4_ = auVar55._12_4_;
          auVar44 = pshuflw(auVar55,auVar74,0xe8);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64 & auVar69,(auVar44 | auVar64 & auVar69) ^ auVar4);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar34[-0xb0] = 0;
          }
          auVar15._4_4_ = auVar55._0_4_;
          auVar15._0_4_ = auVar55._0_4_;
          auVar15._8_4_ = auVar55._8_4_;
          auVar15._12_4_ = auVar55._8_4_;
          auVar74 = auVar73 & auVar15 | auVar74;
          auVar44 = packssdw(auVar74,auVar74);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64,auVar44 ^ auVar5);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._4_2_ >> 8 & 1) != 0) {
            puVar34[-0xa0] = 0;
          }
          auVar64 = (auVar61 | auVar27) ^ auVar31;
          auVar56._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
          auVar56._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
          auVar56._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
          auVar56._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
          auVar75._4_4_ = auVar56._0_4_;
          auVar75._0_4_ = auVar56._0_4_;
          auVar75._8_4_ = auVar56._8_4_;
          auVar75._12_4_ = auVar56._8_4_;
          iVar82 = -(uint)(auVar64._4_4_ == iVar66);
          iVar86 = -(uint)(auVar64._12_4_ == iVar68);
          auVar16._4_4_ = iVar82;
          auVar16._0_4_ = iVar82;
          auVar16._8_4_ = iVar86;
          auVar16._12_4_ = iVar86;
          auVar84._4_4_ = auVar56._4_4_;
          auVar84._0_4_ = auVar56._4_4_;
          auVar84._8_4_ = auVar56._12_4_;
          auVar84._12_4_ = auVar56._12_4_;
          auVar64 = auVar16 & auVar75 | auVar84;
          auVar64 = packssdw(auVar64,auVar64);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64 ^ auVar6,auVar64 ^ auVar6);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar34[-0x90] = 0;
          }
          auVar64 = pshufhw(auVar64,auVar75,0x84);
          auVar17._4_4_ = iVar82;
          auVar17._0_4_ = iVar82;
          auVar17._8_4_ = iVar86;
          auVar17._12_4_ = iVar86;
          auVar69 = pshufhw(auVar56,auVar17,0x84);
          auVar44 = pshufhw(auVar64,auVar84,0x84);
          auVar47._8_4_ = 0xffffffff;
          auVar47._0_8_ = 0xffffffffffffffff;
          auVar47._12_4_ = 0xffffffff;
          auVar47 = (auVar44 | auVar69 & auVar64) ^ auVar47;
          auVar64 = packssdw(auVar47,auVar47);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._6_2_ >> 8 & 1) != 0) {
            puVar34[-0x80] = 0;
          }
          auVar64 = (auVar61 | auVar26) ^ auVar31;
          auVar57._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
          auVar57._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
          auVar57._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
          auVar57._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
          auVar18._4_4_ = auVar57._0_4_;
          auVar18._0_4_ = auVar57._0_4_;
          auVar18._8_4_ = auVar57._8_4_;
          auVar18._12_4_ = auVar57._8_4_;
          auVar69 = pshuflw(auVar84,auVar18,0xe8);
          auVar48._0_4_ = -(uint)(auVar64._0_4_ == iVar63);
          auVar48._4_4_ = -(uint)(auVar64._4_4_ == iVar66);
          auVar48._8_4_ = -(uint)(auVar64._8_4_ == iVar67);
          auVar48._12_4_ = -(uint)(auVar64._12_4_ == iVar68);
          auVar76._4_4_ = auVar48._4_4_;
          auVar76._0_4_ = auVar48._4_4_;
          auVar76._8_4_ = auVar48._12_4_;
          auVar76._12_4_ = auVar48._12_4_;
          auVar64 = pshuflw(auVar48,auVar76,0xe8);
          auVar77._4_4_ = auVar57._4_4_;
          auVar77._0_4_ = auVar57._4_4_;
          auVar77._8_4_ = auVar57._12_4_;
          auVar77._12_4_ = auVar57._12_4_;
          auVar44 = pshuflw(auVar57,auVar77,0xe8);
          auVar58._8_4_ = 0xffffffff;
          auVar58._0_8_ = 0xffffffffffffffff;
          auVar58._12_4_ = 0xffffffff;
          auVar58 = (auVar44 | auVar64 & auVar69) ^ auVar58;
          auVar44 = packssdw(auVar58,auVar58);
          auVar64 = packsswb(auVar64 & auVar69,auVar44);
          if ((auVar64 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar34[-0x70] = 0;
          }
          auVar19._4_4_ = auVar57._0_4_;
          auVar19._0_4_ = auVar57._0_4_;
          auVar19._8_4_ = auVar57._8_4_;
          auVar19._12_4_ = auVar57._8_4_;
          auVar77 = auVar76 & auVar19 | auVar77;
          auVar44 = packssdw(auVar77,auVar77);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar44 = packssdw(auVar44 ^ auVar7,auVar44 ^ auVar7);
          auVar64 = packsswb(auVar64,auVar44);
          if ((auVar64._8_2_ >> 8 & 1) != 0) {
            puVar34[-0x60] = 0;
          }
          auVar64 = (auVar61 | auVar25) ^ auVar31;
          auVar59._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
          auVar59._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
          auVar59._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
          auVar59._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
          auVar78._4_4_ = auVar59._0_4_;
          auVar78._0_4_ = auVar59._0_4_;
          auVar78._8_4_ = auVar59._8_4_;
          auVar78._12_4_ = auVar59._8_4_;
          iVar82 = -(uint)(auVar64._4_4_ == iVar66);
          iVar86 = -(uint)(auVar64._12_4_ == iVar68);
          auVar20._4_4_ = iVar82;
          auVar20._0_4_ = iVar82;
          auVar20._8_4_ = iVar86;
          auVar20._12_4_ = iVar86;
          auVar85._4_4_ = auVar59._4_4_;
          auVar85._0_4_ = auVar59._4_4_;
          auVar85._8_4_ = auVar59._12_4_;
          auVar85._12_4_ = auVar59._12_4_;
          auVar64 = auVar20 & auVar78 | auVar85;
          auVar64 = packssdw(auVar64,auVar64);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64 ^ auVar8,auVar64 ^ auVar8);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar34[-0x50] = 0;
          }
          auVar64 = pshufhw(auVar64,auVar78,0x84);
          auVar21._4_4_ = iVar82;
          auVar21._0_4_ = iVar82;
          auVar21._8_4_ = iVar86;
          auVar21._12_4_ = iVar86;
          auVar69 = pshufhw(auVar59,auVar21,0x84);
          auVar44 = pshufhw(auVar64,auVar85,0x84);
          auVar49._8_4_ = 0xffffffff;
          auVar49._0_8_ = 0xffffffffffffffff;
          auVar49._12_4_ = 0xffffffff;
          auVar49 = (auVar44 | auVar69 & auVar64) ^ auVar49;
          auVar64 = packssdw(auVar49,auVar49);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._10_2_ >> 8 & 1) != 0) {
            puVar34[-0x40] = 0;
          }
          auVar64 = (auVar61 | _DAT_001b1040) ^ auVar31;
          auVar60._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
          auVar60._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
          auVar60._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
          auVar60._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
          auVar22._4_4_ = auVar60._0_4_;
          auVar22._0_4_ = auVar60._0_4_;
          auVar22._8_4_ = auVar60._8_4_;
          auVar22._12_4_ = auVar60._8_4_;
          auVar69 = pshuflw(auVar85,auVar22,0xe8);
          auVar50._0_4_ = -(uint)(auVar64._0_4_ == iVar63);
          auVar50._4_4_ = -(uint)(auVar64._4_4_ == iVar66);
          auVar50._8_4_ = -(uint)(auVar64._8_4_ == iVar67);
          auVar50._12_4_ = -(uint)(auVar64._12_4_ == iVar68);
          auVar79._4_4_ = auVar50._4_4_;
          auVar79._0_4_ = auVar50._4_4_;
          auVar79._8_4_ = auVar50._12_4_;
          auVar79._12_4_ = auVar50._12_4_;
          auVar64 = pshuflw(auVar50,auVar79,0xe8);
          auVar80._4_4_ = auVar60._4_4_;
          auVar80._0_4_ = auVar60._4_4_;
          auVar80._8_4_ = auVar60._12_4_;
          auVar80._12_4_ = auVar60._12_4_;
          auVar44 = pshuflw(auVar60,auVar80,0xe8);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64 & auVar69,(auVar44 | auVar64 & auVar69) ^ auVar9);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar34[-0x30] = 0;
          }
          auVar23._4_4_ = auVar60._0_4_;
          auVar23._0_4_ = auVar60._0_4_;
          auVar23._8_4_ = auVar60._8_4_;
          auVar23._12_4_ = auVar60._8_4_;
          auVar80 = auVar79 & auVar23 | auVar80;
          auVar44 = packssdw(auVar80,auVar80);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64,auVar44 ^ auVar10);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._12_2_ >> 8 & 1) != 0) {
            puVar34[-0x20] = 0;
          }
          auVar64 = (auVar61 | _DAT_001b1030) ^ auVar31;
          auVar51._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
          auVar51._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
          auVar51._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
          auVar51._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
          auVar81._4_4_ = auVar51._0_4_;
          auVar81._0_4_ = auVar51._0_4_;
          auVar81._8_4_ = auVar51._8_4_;
          auVar81._12_4_ = auVar51._8_4_;
          auVar62._4_4_ = -(uint)(auVar64._4_4_ == iVar66);
          auVar62._12_4_ = -(uint)(auVar64._12_4_ == iVar68);
          auVar62._0_4_ = auVar62._4_4_;
          auVar62._8_4_ = auVar62._12_4_;
          auVar65._4_4_ = auVar51._4_4_;
          auVar65._0_4_ = auVar51._4_4_;
          auVar65._8_4_ = auVar51._12_4_;
          auVar65._12_4_ = auVar51._12_4_;
          auVar44 = auVar62 & auVar81 | auVar65;
          auVar64 = packssdw(auVar51,auVar44);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64 ^ auVar11,auVar64 ^ auVar11);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar34[-0x10] = 0;
          }
          auVar64 = pshufhw(auVar64,auVar81,0x84);
          auVar44 = pshufhw(auVar44,auVar62,0x84);
          in_XMM2 = auVar44 & auVar64;
          auVar64 = pshufhw(auVar64,auVar65,0x84);
          auVar52._8_4_ = 0xffffffff;
          auVar52._0_8_ = 0xffffffffffffffff;
          auVar52._12_4_ = 0xffffffff;
          auVar52 = (auVar64 | in_XMM2) ^ auVar52;
          auVar64 = packssdw(auVar52,auVar52);
          in_XMM1 = packsswb(auVar64,auVar64);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            *puVar34 = 0;
          }
          lVar36 = lVar36 + 0x10;
          puVar34 = puVar34 + 0x100;
        } while ((uVar40 - ((uint)uVar32 & 0xf)) + 0x10 != lVar36);
      }
      local_38.m_size = new_hash_size;
    }
    uVar32 = local_20;
    local_28 = 0x20;
    if (1 < new_hash_size) {
      do {
        local_28 = local_28 - 1;
        uVar39 = (uint)uVar37;
        uVar37 = uVar37 >> 1;
      } while (3 < uVar39);
    }
    local_20 = local_20 & 0xffffffff;
    uVar37 = local_20;
    local_20._0_4_ = (uint)uVar32;
    uVar32 = (ulong)(this->m_values).m_size;
    if (uVar32 != 0) {
      prVar38 = (this->m_values).m_p;
      prVar33 = prVar38 + uVar32;
      local_20 = uVar37;
      do {
        if (prVar38->m_bits[0xc] != '\0') {
          uVar39 = (uint)(*(int *)prVar38->m_bits * -0x61c88647) >> ((byte)local_28 & 0x1f);
          puVar35 = (undefined8 *)((long)local_38.m_p + (ulong)uVar39 * 0x10);
          if (*(char *)((long)local_38.m_p + (ulong)uVar39 * 0x10 + 0xc) != '\0') {
            uVar42 = uVar39;
            do {
              uVar41 = uVar42 - 1;
              if (uVar42 == 0) {
                uVar41 = local_38.m_size - 1;
              }
              if (uVar41 == uVar39) goto LAB_0018e6c1;
              puVar35 = puVar35 + -2;
              if (uVar42 == 0) {
                puVar35 = (undefined8 *)((long)local_38.m_p + (ulong)(local_38.m_size - 1) * 0x10);
              }
              uVar42 = uVar41;
            } while (*(char *)((long)puVar35 + 0xc) != '\0');
          }
          uVar24 = *(undefined8 *)(prVar38->m_bits + 8);
          *puVar35 = *(undefined8 *)prVar38->m_bits;
          puVar35[1] = uVar24;
          prVar38->m_bits[0xc] = '\0';
          local_20 = (ulong)((uint)local_20 + 1);
LAB_0018e6c1:
          if ((uint)local_20 == this->m_num_valid) break;
        }
        prVar38 = prVar38 + 1;
      } while (prVar38 != prVar33);
    }
    local_20 = CONCAT44(new_hash_size + 1 >> 1,(uint)local_20);
    prVar38 = (this->m_values).m_p;
    if (prVar38 != (raw_node *)0x0) {
      crnlib_free(prVar38);
      (this->m_values).m_p = (raw_node *)0x0;
      (this->m_values).m_size = 0;
      (this->m_values).m_capacity = 0;
    }
    this->m_hash_shift = 0x20;
    prVar38 = (this->m_values).m_p;
    (this->m_values).m_p = (raw_node *)local_38.m_p;
    uVar1 = (this->m_values).m_size;
    uVar2 = (this->m_values).m_capacity;
    (this->m_values).m_size = local_38.m_size;
    (this->m_values).m_capacity = local_38.m_capacity;
    local_38.m_size = uVar1;
    local_38.m_capacity = uVar2;
    local_38.m_p = prVar38;
    this->m_hash_shift = local_28;
    local_28 = 0x20;
    uVar24._0_4_ = this->m_num_valid;
    uVar24._4_4_ = this->m_grow_threshold;
    this->m_num_valid = (uint)local_20;
    this->m_grow_threshold = local_20._4_4_;
    local_20 = uVar24;
    if (uVar1 != 0) {
      if (prVar38 != (raw_node *)0x0) {
        crnlib_free(prVar38);
        local_38.m_p = (void *)0x0;
        local_38.m_size = 0;
        local_38.m_capacity = 0;
      }
      local_20 = 0;
    }
    local_28 = 0x20;
    if (local_38.m_p != (void *)0x0) {
      crnlib_free(local_38.m_p);
    }
  }
  return;
}

Assistant:

inline void rehash(uint new_hash_size) {
    CRNLIB_ASSERT(new_hash_size >= m_num_valid);
    CRNLIB_ASSERT(math::is_power_of_2(new_hash_size));

    if ((new_hash_size < m_num_valid) || (new_hash_size == m_values.size()))
      return;

    hash_map new_map;
    new_map.m_values.resize(new_hash_size);
    new_map.m_hash_shift = 32U - math::floor_log2i(new_hash_size);
    CRNLIB_ASSERT(new_hash_size == (1U << (32U - new_map.m_hash_shift)));
    new_map.m_grow_threshold = UINT_MAX;

    node* pNode = reinterpret_cast<node*>(m_values.begin());
    node* pNode_end = pNode + m_values.size();

    while (pNode != pNode_end) {
      if (pNode->state) {
        new_map.move_into(pNode);

        if (new_map.m_num_valid == m_num_valid)
          break;
      }

      pNode++;
    }

    new_map.m_grow_threshold = (new_hash_size + 1U) >> 1U;

    m_values.clear_no_destruction();
    m_hash_shift = 32;

    swap(new_map);
  }